

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module,JsValueRef exception)

{
  LPCSTR fileName;
  AutoString local_40;
  void *local_20;
  JsValueRef specifier;
  JsValueRef exception_local;
  JsModuleRecord module_local;
  
  if (exception != (JsValueRef)0x0) {
    local_20 = (JsValueRef)0x0;
    specifier = exception;
    exception_local = module;
    ChakraRTInterface::JsGetModuleHostInfo(module,JsModuleHostInfo_Url,&local_20);
    AutoString::AutoString(&local_40,local_20);
    fileName = AutoString::GetString(&local_40);
    PrintException(fileName,JsErrorScriptException,specifier);
    AutoString::~AutoString(&local_40);
  }
  return JsNoError;
}

Assistant:

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module, JsValueRef exception)
{
    if (exception != nullptr)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(module, JsModuleHostInfo_Url, &specifier);
        PrintException(AutoString(specifier).GetString(), JsErrorCode::JsErrorScriptException, exception);
    }
    return JsNoError;
}